

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlastdiff_s.c
# Opt level: O0

errno_t strlastdiff_s(char *dest,rsize_t dmax,char *src,rsize_t *index)

{
  long lVar1;
  bool bVar2;
  long *in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  _Bool there_is_a_diff;
  char *rp;
  errno_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc6;
  char *in_stack_ffffffffffffffc8;
  char *local_28;
  ulong local_20;
  char *local_18;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  if (in_RCX == (long *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffc8,
               (void *)(ulong)CONCAT16(in_stack_ffffffffffffffc6,
                                       CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                                      ),in_stack_ffffffffffffffbc);
    local_c = 400;
  }
  else {
    *in_RCX = 0;
    if (in_RDI == (char *)0x0) {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffc8,
                 (void *)(ulong)CONCAT16(in_stack_ffffffffffffffc6,
                                         CONCAT24(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0)),
                 in_stack_ffffffffffffffbc);
      local_c = 400;
    }
    else if (in_RDX == (char *)0x0) {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffc8,
                 (void *)(ulong)CONCAT16(in_stack_ffffffffffffffc6,
                                         CONCAT24(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0)),
                 in_stack_ffffffffffffffbc);
      local_c = 400;
    }
    else if (in_RSI == 0) {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffc8,
                 (void *)(ulong)CONCAT16(in_stack_ffffffffffffffc6,
                                         CONCAT24(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0)),
                 in_stack_ffffffffffffffbc);
      local_c = 0x191;
    }
    else {
      local_28 = in_RDX;
      local_20 = in_RSI;
      local_18 = in_RDI;
      if (in_RSI < 0x10000001) {
        while( true ) {
          bVar3 = false;
          if ((*local_18 != '\0') && (bVar3 = false, *local_28 != '\0')) {
            bVar3 = local_20 != 0;
          }
          if (!bVar3) break;
          if (*local_18 != *local_28) {
            bVar2 = true;
            *in_RCX = (long)local_18 - (long)in_RDI;
          }
          local_18 = local_18 + 1;
          local_28 = local_28 + 1;
          local_20 = local_20 - 1;
        }
        if (bVar2) {
          local_c = 0;
        }
        else {
          local_c = 0x198;
        }
      }
      else {
        invoke_safe_str_constraint_handler
                  (in_stack_ffffffffffffffc8,
                   (void *)(ulong)CONCAT16(in_stack_ffffffffffffffc6,
                                           CONCAT24(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0)),
                   in_stack_ffffffffffffffbc);
        local_c = 0x193;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

errno_t
strlastdiff_s(const char *dest, rsize_t dmax,
              const char *src, rsize_t *index)
{
    const char *rp;
    bool there_is_a_diff = false;

    if (index == NULL) {
        invoke_safe_str_constraint_handler("strlastdiff_s: index is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }
    *index = 0;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strlastdiff_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strlastdiff_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0 ) {
        invoke_safe_str_constraint_handler("strlastdiff_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strlastdiff_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /* hold reference point */
    rp = dest;

    /*
     * find the last diff
     */
    while (*dest && *src && dmax) {

        if (*dest != *src) {
            there_is_a_diff = true;
            *index = dest - rp;
        }

        dest++;
        src++;
        dmax--;
    }

    if (there_is_a_diff) {
        return (EOK);
    } else {
        return (ESNODIFF);
    }
}